

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakSet.cpp
# Opt level: O0

void __thiscall
Js::JavascriptWeakSet::ExtractSnapObjectDataInto
          (JavascriptWeakSet *this,SnapObject *objData,SlabAllocator *alloc)

{
  anon_class_16_2_6fa06279 fn;
  void **ppvVar1;
  uint32 local_2c;
  SnapSetInfo *pSStack_28;
  uint32 setCountEst;
  SnapSetInfo *ssi;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  JavascriptWeakSet *this_local;
  
  ssi = (SnapSetInfo *)alloc;
  alloc_local = (SlabAllocator *)objData;
  objData_local = (SnapObject *)this;
  pSStack_28 = TTD::SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapSetInfo>(alloc)
  ;
  local_2c = Size(this);
  pSStack_28->SetSize = 0;
  ppvVar1 = TTD::SlabAllocatorBase<0>::SlabReserveArraySpace<void*>
                      ((SlabAllocatorBase<0> *)ssi,(ulong)(local_2c + 1));
  pSStack_28->SetValueArray = ppvVar1;
  fn.setCountEst = &local_2c;
  fn.ssi = &stack0xffffffffffffffd8;
  Map<Js::JavascriptWeakSet::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject*,TTD::SlabAllocatorBase<0>&)::__0>
            (this,fn);
  if (pSStack_28->SetSize == 0) {
    pSStack_28->SetValueArray = (TTDVar *)0x0;
    TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<void*>
              ((SlabAllocatorBase<0> *)ssi,(ulong)(local_2c + 1));
  }
  else {
    TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<void*>
              ((SlabAllocatorBase<0> *)ssi,(ulong)pSStack_28->SetSize,(ulong)(local_2c + 1));
  }
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapSetInfo*,(TTD::NSSnapObjects::SnapObjectType)25>
            ((SnapObject *)alloc_local,pSStack_28);
  return;
}

Assistant:

void JavascriptWeakSet::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapSetInfo* ssi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapSetInfo>();
        uint32 setCountEst = this->Size();

        ssi->SetSize = 0;
        ssi->SetValueArray = alloc.SlabReserveArraySpace<TTD::TTDVar>(setCountEst + 1); //always reserve at least 1 element

        this->Map([&](RecyclableObject* key)
        {
            AssertMsg(ssi->SetSize < setCountEst, "We are writing junk");

            ssi->SetValueArray[ssi->SetSize] = key;
            ssi->SetSize++;
        });

        if(ssi->SetSize == 0)
        {
            ssi->SetValueArray = nullptr;
            alloc.SlabAbortArraySpace<TTD::TTDVar>(setCountEst + 1);
        }
        else
        {
            alloc.SlabCommitArraySpace<TTD::TTDVar>(ssi->SetSize, setCountEst + 1);
        }

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapSetInfo*, TTD::NSSnapObjects::SnapObjectType::SnapSetObject>(objData, ssi);
    }